

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> * __thiscall
testing::internal::OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::WillByDefault
          (OnCallSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,
          Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *action)

{
  Clause CVar1;
  uint uVar2;
  char *pcVar3;
  ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)> *pAVar4;
  FailureReporterInterface *pFVar5;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  CVar1 = (this->super_UntypedOnCallSpecBase).last_clause_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,".WillByDefault() must appear exactly once in an ON_CALL().","");
  if (1 < (int)CVar1) {
    uVar2 = (this->super_UntypedOnCallSpecBase).line_;
    pcVar3 = (this->super_UntypedOnCallSpecBase).file_;
    pFVar5 = GetFailureReporter();
    (*pFVar5->_vptr_FailureReporterInterface[2])(pFVar5,0,pcVar3,(ulong)uVar2,local_48);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  (this->super_UntypedOnCallSpecBase).last_clause_ = kWillByDefault;
  pAVar4 = (action->impl_).value_;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"DoDefault() cannot be used in ON_CALL().","");
  if (pAVar4 == (ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)0x0) {
    uVar2 = (this->super_UntypedOnCallSpecBase).line_;
    pcVar3 = (this->super_UntypedOnCallSpecBase).file_;
    pFVar5 = GetFailureReporter();
    (*pFVar5->_vptr_FailureReporterInterface[2])(pFVar5,0,pcVar3,(ulong)uVar2,local_48);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  linked_ptr<testing::ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)>_>::
  operator=(&(this->action_).impl_,&action->impl_);
  return this;
}

Assistant:

OnCallSpec& WillByDefault(const Action<F>& action) {
    ExpectSpecProperty(last_clause_ < kWillByDefault,
                       ".WillByDefault() must appear "
                       "exactly once in an ON_CALL().");
    last_clause_ = kWillByDefault;

    ExpectSpecProperty(!action.IsDoDefault(),
                       "DoDefault() cannot be used in ON_CALL().");
    action_ = action;
    return *this;
  }